

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoCaps.cpp
# Opt level: O3

double __thiscall TwoCaps::coordinateZ(TwoCaps *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (G == 0) {
    dVar1 = this->theta2_lb + this->d_theta2 * (double)K;
    this->theta1 = this->theta1_lb + this->d_theta1 * (double)J;
    this->theta2 = dVar1;
    dVar2 = (this->super_Parameterization).radius;
    dVar1 = cos(dVar1);
    dVar1 = dVar1 * dVar2;
  }
  else if (G == 1) {
    dVar2 = this->d_theta2_cap * (double)K + this->theta2_cap_lb;
    this->theta1 = this->d_theta1_cap * (double)J + this->theta1_cap_lb;
    this->theta2 = dVar2;
    sin(dVar2);
    cos(this->theta1);
    dVar1 = (this->super_Parameterization).dx * (double)J + (this->super_Parameterization).x_lb;
    dVar3 = (this->super_Parameterization).dy * (double)K + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).x = dVar1;
    (this->super_Parameterization).y = dVar3;
    dVar2 = (this->super_Parameterization).z_ub;
    dVar1 = SQRT(dVar2 * dVar2 + dVar1 * dVar1 + dVar3 * dVar3);
    this->rad_B = dVar1;
    dVar1 = (this->super_Parameterization).radius / dVar1;
    this->proj = dVar1;
    dVar1 = dVar1 * dVar2;
  }
  else {
    if (G != 2) {
      return (this->super_Parameterization).z;
    }
    dVar2 = this->d_theta2_cap * (double)K + this->theta2_cap_lb;
    this->theta1 = this->d_theta1_cap * (double)J + this->theta1_cap_lb;
    this->theta2 = dVar2;
    sin(dVar2);
    cos(this->theta1);
    dVar1 = -(double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_ub;
    dVar3 = (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).x = dVar1;
    (this->super_Parameterization).y = dVar3;
    dVar2 = (this->super_Parameterization).z_lb;
    dVar1 = SQRT(dVar2 * dVar2 + dVar1 * dVar1 + dVar3 * dVar3);
    this->rad_B = dVar1;
    dVar1 = (this->super_Parameterization).radius / dVar1;
    this->proj = dVar1;
    dVar1 = dVar1 * dVar2;
  }
  (this->super_Parameterization).z = dVar1;
  return dVar1;
}

Assistant:

double TwoCaps::coordinateZ(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Low latitude spherical shell
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      z = radius * cos(theta2);
      break;
    case 1:  // Top cap
      theta1 = theta1_cap_lb + (double)J * d_theta1_cap;
      theta2 = theta2_cap_lb + (double)K * d_theta2_cap;
      z = radius * sin(theta2) * cos(theta1);

      x = x_lb + (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_ub;

      rad_B = sqrt(x * x + y * y + z * z);
      proj = radius / rad_B;
      z *= proj;
      break;
    case 2:  // Bottom cap
      theta1 = theta1_cap_lb + (double)J * d_theta1_cap;
      theta2 = theta2_cap_lb + (double)K * d_theta2_cap;
      z = -radius * sin(theta2) * cos(theta1);

      x = x_ub - (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_lb;

      rad_B = sqrt(x * x + y * y + z * z);
      proj = radius / rad_B;
      z *= proj;
      break;
  }

  return z;
}